

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

VOID ExitProcess(UINT uExitCode)

{
  Volatile<int> VVar1;
  Volatile<int> VVar2;
  DWORD DVar3;
  BOOL BVar4;
  HANDLE pVVar5;
  bool bVar6;
  
  if (!PAL_InitializeChakraCoreCalled) {
LAB_0034275d:
    abort();
  }
  VVar1.m_val = GetCurrentThreadId();
  VVar2.m_val = 0;
  LOCK();
  bVar6 = terminator.m_val != 0;
  if (bVar6) {
    VVar2 = terminator;
    VVar1 = terminator;
  }
  terminator.m_val = VVar1.m_val;
  UNLOCK();
  DVar3 = GetCurrentThreadId();
  if (DVar3 == VVar2.m_val) {
    if (init_count.m_val < 1) goto LAB_00342756;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034275d;
    pVVar5 = GetCurrentProcess();
    PROCEndProcess(pVVar5,uExitCode,0);
  }
  else if (bVar6) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034275d;
    poll((pollfd *)0x0,0,-1);
  }
  BVar4 = PALInitLock();
  if ((BVar4 != 0) && (0 < init_count.m_val)) {
    pVVar5 = GetCurrentProcess();
    PROCEndProcess(pVVar5,uExitCode,0);
    fprintf(_stderr,"] %s %s:%d","ExitProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x49a);
    fprintf(_stderr,"PROCEndProcess has returned\n");
    fprintf(_stderr,"] %s %s:%d","ExitProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x4a5);
    fprintf(_stderr,"ExitProcess should not return!\n");
    do {
    } while( true );
  }
LAB_00342756:
  exit(uExitCode);
}

Assistant:

PAL_NORETURN
VOID
PALAPI
ExitProcess(
    IN UINT uExitCode)
{
    DWORD old_terminator;

    PERF_ENTRY_ONLY(ExitProcess);
    ENTRY("ExitProcess(uExitCode=0x%x)\n", uExitCode );

    old_terminator = InterlockedCompareExchange(&terminator, GetCurrentThreadId(), 0);

    if (GetCurrentThreadId() == old_terminator)
    {
        // This thread has already initiated termination. This can happen
        // in two ways:
        // 1) DllMain(DLL_PROCESS_DETACH) triggers a call to ExitProcess.
        // 2) PAL_exit() is called after the last PALTerminate().
        // If the PAL is still initialized, we go straight through to
        // PROCEndProcess. If it isn't, we simply exit.
        if (!PALIsInitialized())
        {
            exit(uExitCode);
            ASSERT("exit has returned\n");
        }
        else
        {
            WARN("thread re-called ExitProcess\n");
            PROCEndProcess(GetCurrentProcess(), uExitCode, FALSE);
        }
    }
    else if (0 != old_terminator)
    {
        /* another thread has already initiated the termination process. we
           could just block on the PALInitLock critical section, but then
           PROCSuspendOtherThreads would hang... so sleep forever here, we're
           terminating anyway

           Update: [TODO] PROCSuspendOtherThreads has been removed. Can this
           code be changed? */
        WARN("termination already started from another thread; blocking.\n");
        poll(NULL, 0, INFTIM);
    }

    /* ExitProcess may be called even if PAL is not initialized.
       Verify if process structure exist
    */
    if (PALInitLock() && PALIsInitialized())
    {
        PROCEndProcess(GetCurrentProcess(), uExitCode, FALSE);

        /* Should not get here, because we terminate the current process */
        ASSERT("PROCEndProcess has returned\n");
    }
    else
    {
        exit(uExitCode);

        /* Should not get here, because we terminate the current process */
        ASSERT("exit has returned\n");
    }

    /* this should never get executed */
    ASSERT("ExitProcess should not return!\n");
    while (true);
}